

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponential_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::exponential_dist<double>::icdf(exponential_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  param_type *in_RDI;
  double in_XMM0_Qa;
  result_type_conflict2 rVar2;
  undefined8 local_8;
  
  if ((in_XMM0_Qa < 0.0) || (1.0 < in_XMM0_Qa)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  else if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
    rVar2 = param_type::mu(in_RDI);
    local_8 = math::ln(1.67327583792155e-317);
    local_8 = -rVar2 * local_8;
  }
  else {
    local_8 = std::numeric_limits<double>::infinity();
  }
  return local_8;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return -P.mu() * math::ln(1 - x);
    }